

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O3

void __thiscall hdc::Driver::setFlags(Driver *this,int argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  allocator local_71;
  string *local_70;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_68;
  Logger *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (1 < argc) {
    local_58 = (string *)&this->mainFilePath;
    local_70 = &this->outputName;
    local_68 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->searchPath;
    local_60 = &this->logger;
    iVar5 = 1;
    do {
      pcVar1 = argv[iVar5];
      iVar2 = strcmp(pcVar1,"-cpp");
      if (iVar2 == 0) {
        this->emitCppFlag = true;
      }
      else {
        iVar2 = strcmp(pcVar1,"-log");
        if (iVar2 == 0) {
          iVar4 = iVar5 + 1;
          iVar2 = strcmp(argv[(long)iVar5 + 1],"all");
          iVar5 = iVar4;
          if (iVar2 == 0) {
            Logger::setAllFlags(local_60);
          }
        }
        else if (*pcVar1 == '-') {
          if ((pcVar1[1] == 'i') && (pcVar1[2] == '\0')) {
            std::__cxx11::string::string((string *)&local_50,argv[(long)iVar5 + 1],&local_71);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_68,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            iVar5 = iVar5 + 1;
          }
          else {
            if ((pcVar1[1] != 'o') || (pcVar1[2] != '\0')) goto LAB_00171794;
            pcVar1 = argv[(long)iVar5 + 1];
            pcVar3 = (char *)(this->outputName)._M_string_length;
            strlen(pcVar1);
            std::__cxx11::string::_M_replace((ulong)local_70,0,pcVar3,(ulong)pcVar1);
            iVar5 = iVar5 + 1;
          }
        }
        else {
LAB_00171794:
          pcVar3 = strstr(pcVar1,".hd");
          if (pcVar3 != (char *)0x0) {
            std::__cxx11::string::string((string *)&local_50,pcVar1,&local_71);
            std::__cxx11::string::operator=(local_58,(string *)&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
          }
        }
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < argc);
  }
  return;
}

Assistant:

void Driver::setFlags(int argc, char* argv[]) {
    for (int i = 1; i < argc; ++i) {
        if (strcmp(argv[i], "-cpp") == 0) {
            emitCppFlag = true;
        } else if (strcmp(argv[i], "-log") == 0) {
            ++i;

            if (strcmp(argv[i], "all") == 0) {
                logger.setAllFlags();
            }
        } else if (strcmp(argv[i], "-i") == 0) {
            ++i;

            searchPath.push_back(argv[i]);
        } else if (strcmp(argv[i], "-o") == 0) {
            ++i;

            outputName = argv[i];
        } else if (strstr(argv[i], ".hd") != nullptr) {
            mainFilePath = std::string(argv[i]);
        }
    }
}